

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdftocsv.cpp
# Opt level: O0

bool cdftocsv::getdamagebindictionary
               (vector<damagebindictionary,_std::allocator<damagebindictionary>_>
                *damagebindictionary_vec_)

{
  undefined1 auVar1 [16];
  uint uVar2;
  FILE *__stream;
  ulong uVar3;
  void *__ptr;
  size_t sVar4;
  uint local_34;
  uint i;
  damagebindictionary *s1;
  uint nrec;
  longlong sz;
  FILE *fin;
  vector<damagebindictionary,_std::allocator<damagebindictionary>_> *damagebindictionary_vec__local;
  
  __stream = fopen("static/damage_bin_dict.bin","rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: Erroropening %s\n","static/damage_bin_dict.bin");
    exit(-1);
  }
  fseek(__stream,0,2);
  uVar3 = ftell(__stream);
  fseek(__stream,0,0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar2 = SUB164(auVar1 / ZEXT816(0x14),0);
  uVar3 = SUB168(ZEXT416(uVar2) * ZEXT816(0x14),0);
  if (SUB168(ZEXT416(uVar2) * ZEXT816(0x14),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __ptr = operator_new__(uVar3);
  sVar4 = fread(__ptr,0x14,(ulong)uVar2,__stream);
  if (sVar4 != uVar2) {
    fprintf(_stderr,"FATAL: Error reading file\n");
    exit(-1);
  }
  for (local_34 = 0; local_34 < uVar2; local_34 = local_34 + 1) {
    std::vector<damagebindictionary,_std::allocator<damagebindictionary>_>::push_back
              (damagebindictionary_vec_,(value_type *)((long)__ptr + (ulong)local_34 * 0x14));
  }
  if (__ptr != (void *)0x0) {
    operator_delete__(__ptr);
  }
  fclose(__stream);
  return true;
}

Assistant:

bool getdamagebindictionary(std::vector<damagebindictionary> &damagebindictionary_vec_)
	{

		FILE *fin = fopen(DAMAGE_BIN_DICT_FILE, "rb");
		if (fin == NULL) {
			fprintf(stderr, "FATAL: Erroropening %s\n", DAMAGE_BIN_DICT_FILE);
			exit(-1);
		}
		flseek(fin, 0L, SEEK_END);
		long long sz = fltell(fin);
		flseek(fin, 0L, SEEK_SET);
		unsigned int nrec = static_cast<unsigned int> (sz / sizeof(damagebindictionary));
		damagebindictionary *s1 = new damagebindictionary[nrec];
		if (fread(s1, sizeof(damagebindictionary), nrec, fin) != nrec) {
			fprintf(stderr, "FATAL: Error reading file\n");
			exit(-1);
		}

		for (unsigned int i = 0; i < nrec; i++) {
			damagebindictionary_vec_.push_back(s1[i]);
		}
		delete[] s1;

		fclose(fin);
		return true;
	}